

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

DoubleFormatter __thiscall mp::BasicSolver::FormatObjValue(BasicSolver *this,double value)

{
  int iVar1;
  char *__nptr;
  undefined4 extraout_var;
  undefined8 uVar2;
  DoubleFormatter DVar3;
  DoubleFormatter DVar4;
  
  if (-1 < this->obj_precision_) {
    DVar3.precision = this->obj_precision_;
    DVar3.value = value;
    DVar3._12_4_ = 0;
    return DVar3;
  }
  __nptr = getenv("objective_precision");
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    uVar2 = CONCAT44(extraout_var,iVar1);
    if (iVar1 != 0) goto LAB_00345b73;
  }
  uVar2 = 0xf;
LAB_00345b73:
  this->obj_precision_ = (int)uVar2;
  DVar4._8_8_ = uVar2;
  DVar4.value = value;
  return DVar4;
}

Assistant:

BasicSolver::DoubleFormatter BasicSolver::FormatObjValue(double value) {
  if (obj_precision_ < 0) {
    const char *s =  std::getenv("objective_precision");
    obj_precision_ = s ? std::atoi(s) : 0;
    if (obj_precision_ == 0)
      obj_precision_ = DEFAULT_PRECISION;
  }
  DoubleFormatter formatter = {value, obj_precision_};
  return formatter;
}